

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InputOutputPair>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::InputOutputPair> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    kj::anon_unknown_0::InputOutputPair::~InputOutputPair((InputOutputPair *)pointer);
  }
  operator_delete(pointer,0x30);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }